

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O1

char * flatcc_json_parser_integer
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value)

{
  char cVar1;
  byte *pbVar2;
  byte *pbVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  
  if (buf == end) {
    return buf;
  }
  cVar1 = *buf;
  bVar8 = cVar1 == '-';
  *value_sign = (uint)bVar8;
  pbVar3 = (byte *)(buf + bVar8);
  bVar9 = pbVar3 == (byte *)end;
  if ((bVar9) || (bVar7 = *pbVar3, 9 < (byte)(bVar7 - 0x30))) {
    uVar5 = 0;
  }
  else {
    uVar6 = ~((int)buf + (uint)(cVar1 == '-'));
    uVar4 = 0;
    pbVar3 = (byte *)(buf + bVar8);
    do {
      pbVar2 = pbVar3 + 1;
      uVar5 = (ulong)(byte)(bVar7 - 0x30) + uVar4 * 10;
      if (uVar5 < uVar4) {
        if (ctx->error != 0) {
          return end;
        }
        ctx->error = 8;
        ctx->pos = -(uVar6 + *(int *)&ctx->line_start);
        goto LAB_0011705b;
      }
      bVar9 = pbVar2 == (byte *)end;
      pbVar3 = (byte *)end;
      if (bVar9) break;
      bVar7 = *pbVar2;
      uVar6 = uVar6 - 1;
      pbVar3 = pbVar2;
      uVar4 = uVar5;
    } while ((byte)(bVar7 - 0x30) < 10);
  }
  pbVar2 = pbVar3;
  if (pbVar3 != (byte *)buf) {
    if (((bVar9) || (0x37 < *pbVar3 - 0x2e)) ||
       ((0x80000000800001U >> ((ulong)(*pbVar3 - 0x2e) & 0x3f) & 1) == 0)) {
      *value = uVar5;
    }
    else {
      pbVar2 = (byte *)end;
      if (ctx->error == 0) {
        ctx->error = 0xc;
        ctx->pos = ((int)pbVar3 - *(int *)&ctx->line_start) + 1;
LAB_0011705b:
        ctx->error_loc = (char *)pbVar3;
        pbVar2 = (byte *)end;
      }
    }
  }
  return (char *)pbVar2;
}

Assistant:

const char *flatcc_json_parser_integer(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value)
{
    uint64_t x0, x = 0;
    const char *k;

    if (buf == end) {
        return buf;
    }
    k = buf;
    *value_sign = *buf == '-';
    buf += *value_sign;
    while (buf != end && *buf >= '0' && *buf <= '9') {
        x0 = x;
        x = x * 10 + (uint64_t)(*buf - '0');
        if (x0 > x) {
            return flatcc_json_parser_set_error(ctx, buf, end, value_sign ?
                    flatcc_json_parser_error_underflow : flatcc_json_parser_error_overflow);
        }
        ++buf;
    }
    if (buf == k) {
        /* Give up, but don't fail the parse just yet, it might be a valid symbol. */
        return buf;
    }
    if (buf != end && (*buf == 'e' || *buf == 'E' || *buf == '.')) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_float_unexpected);
    }
    *value = x;
    return buf;
}